

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O0

vec4 vec4_apply_mat(vec4 v,mat4 m)

{
  vec4 vVar1;
  float w;
  float z;
  float y;
  float x;
  vec4 v_local;
  
  y = v.x;
  x = v.y;
  v_local.x = v.z;
  v_local.y = v.w;
  vVar1 = vec4_create(m.m[3] * v_local.y + m.m[2] * v_local.x + m.m[0] * y + m.m[1] * x,
                      m.m[7] * v_local.y + m.m[6] * v_local.x + m.m[4] * y + m.m[5] * x,
                      m.m[0xb] * v_local.y + m.m[10] * v_local.x + m.m[8] * y + m.m[9] * x,
                      m.m[0xf] * v_local.y + m.m[0xe] * v_local.x + m.m[0xc] * y + m.m[0xd] * x);
  return vVar1;
}

Assistant:

vec4 vec4_apply_mat(vec4 v, mat4 m) {
    float x = m.m[0] * v.x + m.m[1] * v.y + m.m[2] * v.z + m.m[3] * v.w;
    float y = m.m[4] * v.x + m.m[5] * v.y + m.m[6] * v.z + m.m[7] * v.w;
    float z = m.m[8] * v.x + m.m[9] * v.y + m.m[10] * v.z + m.m[11] * v.w;
    float w = m.m[12] * v.x + m.m[13] * v.y + m.m[14] * v.z + m.m[15] * v.w;
    return vec4_create(x, y, z, w);
}